

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O0

void __thiscall MyEntity::display(MyEntity *this,ostream *os)

{
  ostream *poVar1;
  string *psVar2;
  ostream *os_local;
  MyEntity *this_local;
  
  poVar1 = std::operator<<(os,"Hello! My name is ");
  psVar2 = dynamicgraph::Entity::getName_abi_cxx11_(&this->super_Entity);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1," !");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void display(std::ostream &os) const {
    os << "Hello! My name is " << getName() << " !" << std::endl;
  }